

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

void __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::parseClosingXMLElement
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this)

{
  int iVar1;
  string<char> local_28;
  char *local_18;
  char *pBeginClose;
  CXMLReaderImpl<char,_irr::io::IXMLBase> *this_local;
  
  this->CurrentNodeType = EXN_ELEMENT_END;
  this->IsEmptyElement = false;
  pBeginClose = (char *)this;
  core::array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute>::clear
            (&this->Attributes);
  this->P = this->P + 1;
  local_18 = this->P;
  while (*this->P != '>') {
    this->P = this->P + 1;
  }
  while (iVar1 = isspace((int)this->P[-1]), iVar1 != 0) {
    this->P = this->P + -1;
  }
  core::string<char>::string<char>(&local_28,local_18,*(int *)&this->P - (int)local_18);
  core::string<char>::operator=(&this->NodeName,&local_28);
  core::string<char>::~string(&local_28);
  this->P = this->P + 1;
  return;
}

Assistant:

void parseClosingXMLElement()
	{
		CurrentNodeType = EXN_ELEMENT_END;
		IsEmptyElement = false;
		Attributes.clear();

		++P;
		const char_type* pBeginClose = P;

		while(*P != L'>')
			++P;

    // remove trailing whitespace, if any
    while( std::isspace( P[-1]))
      --P;

		NodeName = core::string<char_type>(pBeginClose, (int)(P - pBeginClose));
		++P;
	}